

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

QString * actionTypeToUString(QString *__return_storage_ptr__,UINT8 action)

{
  undefined7 in_register_00000031;
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch((int)CONCAT71(in_register_00000031,action)) {
  case 0x32:
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    return __return_storage_ptr__;
  default:
    usprintf(__return_storage_ptr__,"Unknown %02Xh",action);
    return __return_storage_ptr__;
  case 0x34:
    break;
  case 0x35:
    break;
  case 0x36:
    goto LAB_00162d2a;
  case 0x37:
    break;
  case 0x38:
LAB_00162d2a:
    psVar1 = (storage_type *)0x7;
    goto LAB_00162d43;
  case 0x39:
  }
  psVar1 = (storage_type *)0x6;
LAB_00162d43:
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString actionTypeToUString(const UINT8 action)
{
    switch (action) {
        case Actions::NoAction:      return UString();
        case Actions::Create:        return UString("Create");
        case Actions::Insert:        return UString("Insert");
        case Actions::Replace:       return UString("Replace");
        case Actions::Remove:        return UString("Remove");
        case Actions::Rebuild:       return UString("Rebuild");
        case Actions::Rebase:        return UString("Rebase");
    }
    
    return usprintf("Unknown %02Xh", action);
}